

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_7::Validator::CheckGet(Validator *this,GetAction *action,Type *out_type)

{
  Module *this_00;
  Location *loc;
  undefined8 uVar1;
  Global *pGVar2;
  Global *global;
  Export *local_38;
  Export *export_;
  Module *module;
  Type *out_type_local;
  GetAction *action_local;
  Validator *this_local;
  
  module = (Module *)out_type;
  out_type_local = (Type *)action;
  action_local = (GetAction *)this;
  this_00 = Script::GetModule(this->script_,
                              &(action->super_ActionMixin<(wabt::ActionType)1>).super_Action.
                               module_var);
  export_ = (Export *)this_00;
  if (this_00 == (Module *)0x0) {
    PrintError(this,(Location *)(out_type_local + 2),"unknown module");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    string_view::string_view((string_view *)&global,(string *)(out_type_local + 0x1c));
    local_38 = Module::GetExport(this_00,_global);
    if (local_38 == (Export *)0x0) {
      loc = (Location *)(out_type_local + 2);
      uVar1 = std::__cxx11::string::c_str((string *)(out_type_local + 0x1c));
      PrintError(this,loc,"unknown global export \"%s\"",uVar1);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      pGVar2 = Module::GetGlobal((Module *)export_,&local_38->var);
      if (pGVar2 == (Global *)0x0) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        *(Type *)&(module->loc).filename.data_ = pGVar2->type;
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::CheckGet(const GetAction* action, Type* out_type) {
  const Module* module = script_->GetModule(action->module_var);
  if (!module) {
    PrintError(&action->loc, "unknown module");
    return Result::Error;
  }

  const Export* export_ = module->GetExport(action->name);
  if (!export_) {
    PrintError(&action->loc, "unknown global export \"%s\"",
               action->name.c_str());
    return Result::Error;
  }

  const Global* global = module->GetGlobal(export_->var);
  if (!global) {
    // This error will have already been reported, just skip it.
    return Result::Error;
  }

  *out_type = global->type;
  return Result::Ok;
}